

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cpp
# Opt level: O3

string * random_string_abi_cxx11_(void)

{
  long lVar1;
  undefined **ppuVar2;
  string *in_RDI;
  iterator ppcVar3;
  int iVar4;
  byte bVar5;
  initializer_list<const_char_*> __l;
  undefined1 local_d0 [8];
  uniform_int_distribution<unsigned_long> dist6;
  undefined1 local_50 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> allowed;
  
  bVar5 = 0;
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"");
  ppuVar2 = &PTR_anon_var_dwarf_3f53_00104d20;
  ppcVar3 = (iterator)local_d0;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *ppcVar3 = *ppuVar2;
    ppuVar2 = ppuVar2 + (ulong)bVar5 * -2 + 1;
    ppcVar3 = ppcVar3 + (ulong)bVar5 * -2 + 1;
  }
  __l._M_len = 0x10;
  __l._M_array = (iterator)local_d0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_50,__l,
             (allocator_type *)
             ((long)&allowed.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  iVar4 = 0x14;
  do {
    dist6._M_param._M_a =
         ((long)allowed.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start - (long)local_50 >> 3) - 1;
    local_d0 = (undefined1  [8])0x0;
    std::uniform_int_distribution<unsigned_long>::operator()
              ((uniform_int_distribution<unsigned_long> *)local_d0,&rng,(param_type *)local_d0);
    std::__cxx11::string::append((char *)in_RDI);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (local_50 != (undefined1  [8])0x0) {
    operator_delete((void *)local_50,
                    (long)allowed.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_50);
  }
  return in_RDI;
}

Assistant:

std::string random_string() {

    std::string buf = "";
    std::vector allowed = {"a", "b", "c", "d", "e", "f", "1", "2", "3", "4", "5", "6", "7", "8", "9", "0"};

    for (int i = 0; i < 20; ++i) {
        std::uniform_int_distribution<std::mt19937::result_type> dist6(0, allowed.size() - 1);
        auto rnd = dist6(rng);

        buf.append(allowed[rnd]);
    }

    return buf;
}